

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUpdateRight(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *vec)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pnVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  type_conflict5 tVar9;
  long lVar10;
  cpp_dec_float<100U,_int,_void> *v;
  int *piVar11;
  int iVar12;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  pnVar5 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar6 = (this->l).idx;
  piVar7 = (this->l).row;
  piVar8 = (this->l).start;
  iVar2 = (this->l).firstUnused;
  for (lVar10 = (long)(this->l).firstUpdate; lVar10 < iVar2; lVar10 = lVar10 + 1) {
    iVar3 = piVar7[lVar10];
    local_d8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar3].m_backend.data._M_elems;
    local_d8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar3].m_backend.data._M_elems + 4;
    local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar3].m_backend.data._M_elems + 8;
    local_d8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar3].m_backend.data._M_elems + 0xc;
    local_d8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_d8.exp = vec[iVar3].m_backend.exp;
    local_d8.neg = vec[iVar3].m_backend.neg;
    local_d8.fpclass = vec[iVar3].m_backend.fpclass;
    local_d8.prec_elem = vec[iVar3].m_backend.prec_elem;
    local_88.data._M_elems[0] = 0;
    local_88.data._M_elems[1] = 0;
    tVar9 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_d8,(double *)&local_88);
    if (tVar9) {
      iVar3 = piVar8[lVar10];
      piVar11 = piVar6 + iVar3;
      v = &pnVar5[iVar3].m_backend;
      for (iVar12 = piVar8[lVar10 + 1]; iVar3 < iVar12; iVar12 = iVar12 + -1) {
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_88,&local_d8,v);
        iVar4 = *piVar11;
        piVar11 = piVar11 + 1;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&vec[iVar4].m_backend,&local_88);
        v = v + 1;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUpdateRight(R* vec)
{
   int i, j, k;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
            vec[*idx++] -= x * (*val++);
      }
   }
}